

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

bool __thiscall ProcessProgress::process_shutdown(ProcessProgress *this,int wstatus)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint uVar4;
  uint uVar5;
  byte local_21;
  
  do {
    bVar2 = process_once(this);
  } while (bVar2);
  (this->parse_buffer)._M_string_length = 0;
  *(this->parse_buffer)._M_dataplus._M_p = '\0';
  this->heartbeats = -1;
  close_and_remove_epoll_entry(&this->crash_fd);
  close_and_remove_epoll_entry(&this->timer_fd);
  close_and_remove_epoll_entry(&this->watchdog_timer_fd);
  Global::active_processes = Global::active_processes + -1;
  uVar1 = this->pid;
  this->pid = -1;
  if ((wstatus & 0xff7fU) != 0) {
    uVar5 = wstatus & 0x7f;
    if (uVar5 == 9) {
      if (this->expect_kill == true) {
        process_shutdown((ProcessProgress *)_stderr);
        goto LAB_00133dd5;
      }
      fprintf(_stderr,
              "Fossilize ERROR: Process index %u (PID: %d) failed and it had to be killed in timeout with SIGKILL.\n"
              ,(ulong)this->index,(ulong)uVar1);
      fflush(_stderr);
    }
    if (((int)(uVar5 * 0x1000000 + 0x1000000) < 0x2000000) ||
       ((uVar5 < 0xc && ((0xa01U >> (wstatus & 0x1fU) & 1) != 0)))) {
      uVar5 = this->graphics_progress;
      if ((((int)uVar5 < 0) || (uVar3 = this->compute_progress, (int)uVar3 < 0)) ||
         (uVar4 = this->raytracing_progress, (int)uVar4 < 0)) {
        process_shutdown();
        local_21 = (byte)((ulong)in_RAX >> 0x38);
        goto LAB_00133dd7;
      }
      if (Global::control_block != 0) {
        LOCK();
        *(int *)(Global::control_block + 0x30) = *(int *)(Global::control_block + 0x30) + 1;
        UNLOCK();
        uVar3 = this->compute_progress;
        uVar5 = this->graphics_progress;
        uVar4 = this->raytracing_progress;
      }
      this->start_graphics_index = uVar5;
      this->start_compute_index = uVar3;
      this->start_raytracing_index = uVar4;
      if (((uVar5 < this->end_graphics_index) || (uVar3 < this->end_compute_index)) ||
         (uVar4 < this->end_raytracing_index)) {
        fprintf(_stderr,"Fossilize ERROR: Process index %u (PID: %d) crashed, but will retry.\n",
                (ulong)this->index,(ulong)uVar1);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize ERROR:   New graphics range (%u, %u)\n",
                (ulong)this->start_graphics_index,(ulong)this->end_graphics_index);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize ERROR:   New compute range (%u, %u)\n",
                (ulong)this->start_compute_index,(ulong)this->end_compute_index);
        fflush(_stderr);
        fprintf(_stderr,"Fossilize ERROR:   New raytracing range (%u, %u)\n",
                (ulong)this->start_raytracing_index,(ulong)this->end_raytracing_index);
        fflush(_stderr);
        local_21 = 1;
        goto LAB_00133dd7;
      }
      process_shutdown();
    }
    else {
      local_21 = 0;
      fprintf(_stderr,
              "Fossilize ERROR: Process index %u (PID: %d) failed to terminate in a clean fashion (signal %d). We cannot continue replaying.\n"
              ,(ulong)this->index,(ulong)uVar1,(ulong)uVar5);
      fflush(_stderr);
      if (Global::control_block == 0) goto LAB_00133dd7;
      LOCK();
      *(int *)(Global::control_block + 0x34) = *(int *)(Global::control_block + 0x34) + 1;
      UNLOCK();
    }
  }
LAB_00133dd5:
  local_21 = 0;
LAB_00133dd7:
  return (bool)(local_21 & 1);
}

Assistant:

bool ProcessProgress::process_shutdown(int wstatus)
{
	// Flush out all messages we got.
	while (process_once());
	parse_buffer.clear();
	heartbeats = -1;

	close_and_remove_epoll_entry(crash_fd);
	// Close the timerfd.
	close_and_remove_epoll_entry(timer_fd);
	close_and_remove_epoll_entry(watchdog_timer_fd);

	// Reap child process.
	Global::active_processes--;
	auto wait_pid = pid;
	pid = -1;

	// If application exited in normal manner, we are done.
	if (WIFEXITED(wstatus) && WEXITSTATUS(wstatus) == 0)
		return false;

	if (WIFSIGNALED(wstatus) && WTERMSIG(wstatus) == SIGKILL && expect_kill)
	{
		LOGI("Parent process is shutting down. Expected SIGKILL.\n");
		return false;
	}

	if (WIFSIGNALED(wstatus) && WTERMSIG(wstatus) == SIGKILL)
	{
		// We had to kill the process early. Log this for debugging.
		LOGE("Process index %u (PID: %d) failed and it had to be killed in timeout with SIGKILL.\n",
		     index, wait_pid);
	}

	// If the child did not exit in a normal manner, we failed to catch any crashing signal.
	// Do not try any further.
	if (!WIFEXITED(wstatus) && WIFSIGNALED(wstatus) &&
	    (WTERMSIG(wstatus) != SIGKILL && WTERMSIG(wstatus) != SIGSEGV))
	{
		LOGE("Process index %u (PID: %d) failed to terminate in a clean fashion (signal %d). We cannot continue replaying.\n",
		     index, wait_pid, WTERMSIG(wstatus));

		if (Global::control_block)
			Global::control_block->dirty_process_deaths.fetch_add(1, std::memory_order_relaxed);
		return false;
	}

	// We might have crashed, but we never saw any progress marker.
	// We do not know what to do from here, so we just terminate.
	if (graphics_progress < 0 || compute_progress < 0 || raytracing_progress < 0)
	{
		LOGE("Child process %d terminated before we could receive progress. Cannot continue.\n",
		     wait_pid);
		if (Global::control_block)
			Global::control_block->dirty_process_deaths.fetch_add(1, std::memory_order_relaxed);
		return false;
	}

	if (Global::control_block)
		Global::control_block->clean_process_deaths.fetch_add(1, std::memory_order_relaxed);

	start_graphics_index = uint32_t(graphics_progress);
	start_compute_index = uint32_t(compute_progress);
	start_raytracing_index = uint32_t(raytracing_progress);
	if (start_graphics_index >= end_graphics_index &&
	    start_compute_index >= end_compute_index &&
	    start_raytracing_index >= end_raytracing_index)
	{
		LOGE("Process index %u (PID: %d) crashed, but there is nothing more to replay.\n", index, wait_pid);
		return false;
	}
	else
	{
		LOGE("Process index %u (PID: %d) crashed, but will retry.\n", index, wait_pid);
		LOGE("  New graphics range (%u, %u)\n", start_graphics_index, end_graphics_index);
		LOGE("  New compute range (%u, %u)\n", start_compute_index, end_compute_index);
		LOGE("  New raytracing range (%u, %u)\n", start_raytracing_index, end_raytracing_index);
		return true;
	}
}